

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_info_subject_alt_name
              (char **buf,size_t *size,mbedtls_x509_sequence *subject_alt_name,char *prefix)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  mbedtls_asn1_named_data *pmVar8;
  size_t __maxlen;
  ulong uVar9;
  ulong uVar10;
  size_t size_00;
  bool bVar11;
  undefined1 auStack_98 [8];
  mbedtls_x509_subject_alternative_name san;
  
  __maxlen = *size;
  pcVar7 = *buf;
  do {
    if (subject_alt_name == (mbedtls_x509_sequence *)0x0) {
      *pcVar7 = '\0';
      *size = __maxlen;
      *buf = pcVar7;
      return 0;
    }
    san.san.directory_name.next = (mbedtls_asn1_named_data *)0x0;
    san.san._56_8_ = 0;
    san.san.directory_name.val.len = 0;
    san.san.directory_name.val.p = (uchar *)0x0;
    san.san.other_name.type_id.p = (uchar *)0x0;
    san.san._24_8_ = 0;
    san.san._0_8_ = 0;
    san.san.other_name.type_id.len = 0;
    auStack_98 = (undefined1  [8])0x0;
    san.type = 0;
    san._4_4_ = 0;
    iVar1 = mbedtls_x509_parse_subject_alt_name
                      (&subject_alt_name->buf,(mbedtls_x509_subject_alternative_name *)auStack_98);
    if (iVar1 != 0) {
      if (iVar1 == -0x2080) {
        pcVar6 = "\n%s    <unsupported>";
      }
      else {
        pcVar6 = "\n%s    <malformed>";
      }
      uVar2 = snprintf(pcVar7,__maxlen,pcVar6,prefix);
      if ((int)uVar2 < 0) {
        return -0x2980;
      }
      uVar4 = (ulong)uVar2;
      if (__maxlen <= uVar4) {
        return -0x2980;
      }
      __maxlen = __maxlen - uVar4;
      pcVar7 = pcVar7 + uVar4;
      goto LAB_001e2e2b;
    }
    switch((ulong)auStack_98 & 0xffffffff) {
    case 0:
      uVar2 = snprintf(pcVar7,__maxlen,"\n%s    otherName :",prefix);
      if ((int)uVar2 < 0) {
        return -0x2980;
      }
      uVar4 = (ulong)uVar2;
      bVar11 = __maxlen < uVar4;
      __maxlen = __maxlen - uVar4;
      if (bVar11 || __maxlen == 0) {
        return -0x2980;
      }
      pcVar7 = pcVar7 + uVar4;
      if ((san.san._0_8_ == 8) && (*(long *)san.san.other_name.type_id.len == 0x40807050501062b)) {
        uVar2 = snprintf(pcVar7,__maxlen,"\n%s        hardware module name :",prefix);
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        uVar4 = (ulong)uVar2;
        uVar9 = __maxlen - uVar4;
        if (__maxlen < uVar4 || uVar9 == 0) {
          return -0x2980;
        }
        pcVar7 = pcVar7 + uVar4;
        uVar2 = snprintf(pcVar7,uVar9,"\n%s            hardware type          : ",prefix);
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        uVar4 = (ulong)uVar2;
        uVar10 = uVar9 - uVar4;
        if (uVar9 < uVar4 || uVar10 == 0) {
          return -0x2980;
        }
        pcVar7 = pcVar7 + uVar4;
        uVar2 = mbedtls_oid_get_numeric_string
                          (pcVar7,uVar10,(mbedtls_asn1_buf *)&san.san.directory_name.oid.p);
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        uVar4 = (ulong)uVar2;
        uVar9 = uVar10 - uVar4;
        if (uVar10 < uVar4 || uVar9 == 0) {
          return -0x2980;
        }
        uVar2 = snprintf(pcVar7 + uVar4,uVar9,"\n%s            hardware serial number : ",prefix);
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        uVar10 = (ulong)uVar2;
        __maxlen = uVar9 - uVar10;
        if (uVar9 < uVar10 || __maxlen == 0) {
          return -0x2980;
        }
        pcVar7 = pcVar7 + uVar4 + uVar10;
        for (pmVar8 = (mbedtls_asn1_named_data *)0x0; pmVar8 < san.san.directory_name.next;
            pmVar8 = (mbedtls_asn1_named_data *)((long)&(pmVar8->oid).tag + 1)) {
          uVar2 = snprintf(pcVar7,__maxlen,"%02X",
                           (ulong)*(byte *)((long)&(pmVar8->oid).tag + san.san._56_8_));
          if ((int)uVar2 < 0) {
            return -0x2980;
          }
          uVar4 = (ulong)uVar2;
          bVar11 = __maxlen < uVar4;
          __maxlen = __maxlen - uVar4;
          if (bVar11 || __maxlen == 0) {
            return -0x2980;
          }
          pcVar7 = pcVar7 + uVar4;
        }
      }
      goto LAB_001e2e1f;
    case 1:
    case 2:
      pcVar6 = "rfc822Name";
      if (auStack_98._0_4_ == 2) {
        pcVar6 = "dNSName";
      }
      uVar2 = snprintf(pcVar7,__maxlen,"\n%s    %s : ",prefix,pcVar6);
      break;
    default:
      uVar2 = snprintf(pcVar7,__maxlen,"\n%s    <unsupported>",prefix);
      if ((int)uVar2 < 0) {
        return -0x2980;
      }
      uVar4 = (ulong)uVar2;
      bVar11 = __maxlen < uVar4;
      __maxlen = __maxlen - uVar4;
      if (bVar11 || __maxlen == 0) {
        return -0x2980;
      }
      goto LAB_001e2e1c;
    case 4:
      uVar2 = snprintf(pcVar7,__maxlen,"\n%s    directoryName : ",prefix);
      if ((int)uVar2 < 0) {
LAB_001e2e63:
        mbedtls_x509_free_subject_alt_name((mbedtls_x509_subject_alternative_name *)auStack_98);
        return -0x2980;
      }
      uVar4 = (ulong)uVar2;
      size_00 = __maxlen - uVar4;
      if (__maxlen < uVar4 || size_00 == 0) goto LAB_001e2e63;
      pcVar7 = pcVar7 + uVar4;
      uVar3 = mbedtls_x509_dn_gets(pcVar7,size_00,(mbedtls_x509_name *)&san);
      uVar5 = ZEXT48(uVar3);
      if ((int)uVar3 < 0) {
        mbedtls_x509_free_subject_alt_name((mbedtls_x509_subject_alternative_name *)auStack_98);
        goto LAB_001e2e83;
      }
      goto LAB_001e2d17;
    case 6:
      uVar2 = snprintf(pcVar7,__maxlen,"\n%s    uniformResourceIdentifier : ",prefix);
      break;
    case 7:
      uVar2 = snprintf(pcVar7,__maxlen,"\n%s    %s : ",prefix,"iPAddress");
      uVar3 = 0xffffd680;
      if ((int)uVar2 < 0) {
        return -0x2980;
      }
      uVar4 = (ulong)uVar2;
      uVar9 = __maxlen - uVar4;
      if (__maxlen < uVar4 || uVar9 == 0) {
        return -0x2980;
      }
      pcVar7 = pcVar7 + uVar4;
      if (uVar9 <= (ulong)san.san._0_8_) goto LAB_001e2e83;
      if (san.san._0_8_ == 0x10) {
        uVar2 = snprintf(pcVar7,uVar9,"%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X",
                         (ulong)*(byte *)san.san.other_name.type_id.len,
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 1),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 2),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 3),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 4),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 5),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 6),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 7),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 8),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 9),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 10),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 0xb),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 0xc),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 0xd),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 0xe),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 0xf));
      }
      else {
        if (san.san._0_8_ != 4) {
          *pcVar7 = '\0';
          return -0x2800;
        }
        uVar2 = snprintf(pcVar7,uVar9,"%u.%u.%u.%u",(ulong)*(byte *)san.san.other_name.type_id.len,
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 1),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 2),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 3));
      }
      if ((int)uVar2 < 0) {
        return -0x2980;
      }
      uVar4 = (ulong)uVar2;
      if (uVar9 <= uVar4) {
        return -0x2980;
      }
      __maxlen = uVar9 - uVar4;
LAB_001e2e1c:
      pcVar7 = pcVar7 + uVar4;
      goto LAB_001e2e1f;
    }
    uVar3 = 0xffffd680;
    if ((int)uVar2 < 0) {
      return -0x2980;
    }
    uVar4 = (ulong)uVar2;
    size_00 = __maxlen - uVar4;
    if (__maxlen < uVar4 || size_00 == 0) {
      return -0x2980;
    }
    pcVar7 = pcVar7 + uVar4;
    if (size_00 <= (ulong)san.san._0_8_) {
LAB_001e2e83:
      *pcVar7 = '\0';
      return uVar3;
    }
    memcpy(pcVar7,(void *)san.san.other_name.type_id.len,san.san._0_8_);
    uVar5 = san.san._0_8_;
LAB_001e2d17:
    pcVar7 = pcVar7 + uVar5;
    __maxlen = size_00 - uVar5;
LAB_001e2e1f:
    mbedtls_x509_free_subject_alt_name((mbedtls_x509_subject_alternative_name *)auStack_98);
LAB_001e2e2b:
    subject_alt_name = subject_alt_name->next;
  } while( true );
}

Assistant:

int mbedtls_x509_info_subject_alt_name(char **buf, size_t *size,
                                       const mbedtls_x509_sequence
                                       *subject_alt_name,
                                       const char *prefix)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = subject_alt_name;
    mbedtls_x509_subject_alternative_name san;
    int parse_ret;

    while (cur != NULL) {
        memset(&san, 0, sizeof(san));
        parse_ret = mbedtls_x509_parse_subject_alt_name(&cur->buf, &san);
        if (parse_ret != 0) {
            if (parse_ret == MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
                ret = mbedtls_snprintf(p, n, "\n%s    <unsupported>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
            } else {
                ret = mbedtls_snprintf(p, n, "\n%s    <malformed>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
            }
            cur = cur->next;
            continue;
        }

        switch (san.type) {
            /*
             * otherName
             */
            case MBEDTLS_X509_SAN_OTHER_NAME:
            {
                mbedtls_x509_san_other_name *other_name = &san.san.other_name;

                ret = mbedtls_snprintf(p, n, "\n%s    otherName :", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;

                if (MBEDTLS_OID_CMP(MBEDTLS_OID_ON_HW_MODULE_NAME,
                                    &other_name->type_id) == 0) {
                    ret = mbedtls_snprintf(p, n, "\n%s        hardware module name :", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                    ret =
                        mbedtls_snprintf(p, n, "\n%s            hardware type          : ", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    ret = mbedtls_oid_get_numeric_string(p,
                                                         n,
                                                         &other_name->value.hardware_module_name.oid);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    ret =
                        mbedtls_snprintf(p, n, "\n%s            hardware serial number : ", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    for (i = 0; i < other_name->value.hardware_module_name.val.len; i++) {
                        ret = mbedtls_snprintf(p,
                                               n,
                                               "%02X",
                                               other_name->value.hardware_module_name.val.p[i]);
                        MBEDTLS_X509_SAFE_SNPRINTF;
                    }
                }/* MBEDTLS_OID_ON_HW_MODULE_NAME */
            }
            break;
            /*
             * uniformResourceIdentifier
             */
            case MBEDTLS_X509_SAN_UNIFORM_RESOURCE_IDENTIFIER:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    uniformResourceIdentifier : ", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                memcpy(p, san.san.unstructured_name.p, san.san.unstructured_name.len);
                p += san.san.unstructured_name.len;
                n -= san.san.unstructured_name.len;
            }
            break;
            /*
             * dNSName
             * RFC822 Name
             */
            case MBEDTLS_X509_SAN_DNS_NAME:
            case MBEDTLS_X509_SAN_RFC822_NAME:
            {
                const char *dns_name = "dNSName";
                const char *rfc822_name = "rfc822Name";

                ret = mbedtls_snprintf(p, n,
                                       "\n%s    %s : ",
                                       prefix,
                                       san.type ==
                                       MBEDTLS_X509_SAN_DNS_NAME ? dns_name : rfc822_name);
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                memcpy(p, san.san.unstructured_name.p, san.san.unstructured_name.len);
                p += san.san.unstructured_name.len;
                n -= san.san.unstructured_name.len;
            }
            break;
            /*
             * iPAddress
             */
            case MBEDTLS_X509_SAN_IP_ADDRESS:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    %s : ",
                                       prefix, "iPAddress");
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                unsigned char *ip = san.san.unstructured_name.p;
                // Only IPv6 (16 bytes) and IPv4 (4 bytes) types are supported
                if (san.san.unstructured_name.len == 4) {
                    ret = mbedtls_snprintf(p, n, "%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                } else if (san.san.unstructured_name.len == 16) {
                    ret = mbedtls_snprintf(p, n,
                                           "%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X",
                                           ip[0], ip[1], ip[2], ip[3], ip[4], ip[5], ip[6],
                                           ip[7], ip[8], ip[9], ip[10], ip[11], ip[12], ip[13],
                                           ip[14], ip[15]);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                } else {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
                }
            }
            break;
            /*
             * directoryName
             */
            case MBEDTLS_X509_SAN_DIRECTORY_NAME:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    directoryName : ", prefix);
                if (ret < 0 || (size_t) ret >= n) {
                    mbedtls_x509_free_subject_alt_name(&san);
                }

                MBEDTLS_X509_SAFE_SNPRINTF;
                ret = mbedtls_x509_dn_gets(p, n, &san.san.directory_name);

                if (ret < 0) {
                    mbedtls_x509_free_subject_alt_name(&san);
                    if (n > 0) {
                        *p = '\0';
                    }
                    return ret;
                }

                p += ret;
                n -= ret;
            }
            break;
            /*
             * Type not supported, skip item.
             */
            default:
                ret = mbedtls_snprintf(p, n, "\n%s    <unsupported>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
                break;
        }

        /* So far memory is freed only in the case of directoryName
         * parsing succeeding, as mbedtls_x509_get_name allocates memory. */
        mbedtls_x509_free_subject_alt_name(&san);
        cur = cur->next;
    }

    *p = '\0';

    *size = n;
    *buf = p;

    return 0;
}